

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O1

void printtypeinfo(rnntypeinfo *ti,char *prefix,int shift,char *file)

{
  long lVar1;
  
  if ((long)ti->shr != 0) {
    printdef(prefix,"SHR",1,(long)ti->shr,file);
  }
  if (ti->minvalid != 0) {
    printdef(prefix,"MIN",0,ti->min,file);
  }
  if (ti->maxvalid != 0) {
    printdef(prefix,"MAX",0,ti->max,file);
  }
  if (ti->alignvalid != 0) {
    printdef(prefix,"ALIGN",0,ti->align,file);
  }
  if (ti->radixvalid != 0) {
    printdef(prefix,"RADIX",0,ti->radix,file);
  }
  if (0 < ti->valsnum) {
    lVar1 = 0;
    do {
      printvalue(ti->vals[lVar1],shift);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ti->valsnum);
  }
  if (0 < ti->bitfieldsnum) {
    lVar1 = 0;
    do {
      printbitfield(ti->bitfields[lVar1],shift);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ti->bitfieldsnum);
  }
  return;
}

Assistant:

void printtypeinfo (struct rnntypeinfo *ti, char *prefix, int shift, char *file) {
	if (ti->shr)
		printdef (prefix, "SHR", 1, ti->shr, file);
	if (ti->minvalid)
		printdef (prefix, "MIN", 0, ti->min, file);
	if (ti->maxvalid)
		printdef (prefix, "MAX", 0, ti->max, file);
	if (ti->alignvalid)
		printdef (prefix, "ALIGN", 0, ti->align, file);
	if (ti->radixvalid)
		printdef (prefix, "RADIX", 0, ti->radix, file);
	int i;
	for (i = 0; i < ti->valsnum; i++)
		printvalue(ti->vals[i], shift);
	for (i = 0; i < ti->bitfieldsnum; i++)
		printbitfield(ti->bitfields[i], shift);
}